

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

Quat rw::lerp(Quat *q,Quat *p,float32 r)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  Quat QVar9;
  
  uVar1 = q->x;
  uVar3 = q->y;
  uVar2 = q->z;
  uVar4 = q->w;
  fVar5 = q->x;
  fVar6 = q->y;
  fVar7 = q->z;
  fVar8 = q->w;
  if ((float)p->z * (float)uVar2 +
      (float)p->y * (float)uVar3 + (float)p->w * (float)uVar4 + (float)uVar1 * (float)p->x < 0.0) {
    fVar5 = (float32)-(float)fVar5;
    fVar6 = (float32)-(float)fVar6;
    fVar7 = (float32)-(float)fVar7;
    fVar8 = (float32)-(float)fVar8;
  }
  QVar9.x = (float)r * ((float)p->x - (float)fVar5) + (float)fVar5;
  QVar9.y = (float)r * ((float)p->y - (float)fVar6) + (float)fVar6;
  QVar9.w = (float32)((float)r * ((float)p->w - (float)fVar8) + (float)fVar8);
  QVar9.z = (float32)((float)r * ((float)p->z - (float)fVar7) + (float)fVar7);
  return QVar9;
}

Assistant:

Quat
lerp(const Quat &q, const Quat &p, float32 r)
{
	float32 c;
	Quat q1 = q;
	c = dot(q1, p);
	if(c < 0.0f){
		c = -c;
		q1 = negate(q1);
	}
	return makeQuat(q1.w + r*(p.w - q1.w),
	                q1.x + r*(p.x - q1.x),
	                q1.y + r*(p.y - q1.y),
	                q1.z + r*(p.z - q1.z));
}